

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isPossibleParamAssignment(TokenKind kind)

{
  bool bVar1;
  
  if ((kind & ~EndOfFile) == Comma) {
    return true;
  }
  bVar1 = isPossibleExpression(kind);
  return bVar1;
}

Assistant:

bool SyntaxFacts::isPossibleParamAssignment(TokenKind kind) {
    // allow a comma here to handle cases like:  foo #(, 3);
    switch (kind) {
        case TokenKind::Dot:
        case TokenKind::Comma:
            return true;
        default:
            return isPossibleExpression(kind);
    }
}